

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borromean_impl.h
# Opt level: O1

int secp256k1_borromean_sign
              (secp256k1_ecmult_gen_context *ecmult_gen_ctx,uchar *e0,secp256k1_scalar *s,
              secp256k1_gej *pubs,secp256k1_scalar *k,secp256k1_scalar *sec,size_t *rsizes,
              size_t *secidx,size_t nrings,uchar *m,size_t mlen)

{
  secp256k1_scalar *psVar1;
  uint uVar2;
  long lVar3;
  secp256k1_gej *psVar4;
  secp256k1_scalar *psVar5;
  size_t sVar6;
  ulong uVar7;
  secp256k1_scalar ens;
  size_t size;
  uchar tmp [33];
  secp256k1_gej rgej;
  secp256k1_ge rge;
  secp256k1_sha256 sha256_e0;
  int local_29c;
  uint local_298;
  uint local_294;
  long local_290;
  uint local_284;
  secp256k1_scalar *local_280;
  secp256k1_scalar local_278;
  size_t local_250;
  uchar *local_248;
  secp256k1_scalar *local_240;
  secp256k1_gej *local_238;
  secp256k1_scalar *local_230;
  secp256k1_scalar *local_228;
  secp256k1_gej *local_220;
  secp256k1_scalar *local_218;
  secp256k1_ecmult_gen_context *local_210;
  uchar local_208 [40];
  secp256k1_sha256 local_1e0;
  secp256k1_gej local_178;
  secp256k1_ge local_f8;
  secp256k1_sha256 local_98;
  
  local_98.s[0] = 0x6a09e667;
  local_98.s[1] = 0xbb67ae85;
  local_98.s[2] = 0x3c6ef372;
  local_98.s[3] = 0xa54ff53a;
  local_98.s[4] = 0x510e527f;
  local_98.s[5] = 0x9b05688c;
  local_98.s[6] = 0x1f83d9ab;
  local_98.s[7] = 0x5be0cd19;
  local_98.bytes = 0;
  local_248 = e0;
  local_240 = s;
  local_238 = pubs;
  local_230 = k;
  local_228 = sec;
  if (nrings != 0) {
    local_218 = s + 1;
    local_220 = pubs + 1;
    local_290 = 0;
    sVar6 = 0;
    local_210 = ecmult_gen_ctx;
    do {
      secp256k1_ecmult_gen(local_210,&local_178,local_230 + sVar6);
      secp256k1_ge_set_gej(&local_f8,&local_178);
      if (local_178.infinity != 0) {
        return 0;
      }
      secp256k1_eckey_pubkey_serialize(&local_f8,local_208,&local_250,1);
      uVar7 = secidx[sVar6] + 1;
      if (uVar7 < rsizes[sVar6]) {
        uVar2 = (uint)sVar6;
        local_284 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
        lVar3 = secidx[sVar6] + local_290;
        psVar5 = local_218 + lVar3;
        psVar4 = local_220 + lVar3;
        do {
          local_1e0.s[0] = 0x6a09e667;
          local_1e0.s[1] = 0xbb67ae85;
          local_1e0.s[2] = 0x3c6ef372;
          local_1e0.s[3] = 0xa54ff53a;
          local_1e0.s[4] = 0x510e527f;
          local_1e0.s[5] = 0x9b05688c;
          local_1e0.s[6] = 0x1f83d9ab;
          local_1e0.s[7] = 0x5be0cd19;
          local_1e0.bytes = 0;
          local_294 = local_284;
          uVar2 = (uint)uVar7;
          local_298 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                      uVar2 << 0x18;
          local_280 = psVar5;
          secp256k1_sha256_write(&local_1e0,local_208,0x21);
          secp256k1_sha256_write(&local_1e0,m,mlen);
          secp256k1_sha256_write(&local_1e0,(uchar *)&local_294,4);
          secp256k1_sha256_write(&local_1e0,(uchar *)&local_298,4);
          secp256k1_sha256_finalize(&local_1e0,local_208);
          secp256k1_scalar_set_b32(&local_278,local_208,&local_29c);
          if (local_29c != 0) {
            return 0;
          }
          if (((local_278.d[1] == 0 && local_278.d[0] == 0) && local_278.d[2] == 0) &&
              local_278.d[3] == 0) {
            return 0;
          }
          secp256k1_ecmult(&local_178,psVar4,&local_278,local_280);
          if (local_178.infinity != 0) {
            return 0;
          }
          secp256k1_ge_set_gej_var(&local_f8,&local_178);
          psVar5 = local_280;
          secp256k1_eckey_pubkey_serialize(&local_f8,local_208,&local_250,1);
          uVar7 = uVar7 + 1;
          psVar5 = psVar5 + 1;
          psVar4 = psVar4 + 1;
        } while (uVar7 < rsizes[sVar6]);
      }
      secp256k1_sha256_write(&local_98,local_208,local_250);
      local_290 = local_290 + rsizes[sVar6];
      sVar6 = sVar6 + 1;
    } while (sVar6 != nrings);
  }
  secp256k1_sha256_write(&local_98,m,mlen);
  secp256k1_sha256_finalize(&local_98,local_248);
  if (nrings != 0) {
    local_290 = 0;
    local_280 = (secp256k1_scalar *)0x0;
    do {
      local_1e0.s[0] = 0x6a09e667;
      local_1e0.s[1] = 0xbb67ae85;
      local_1e0.s[2] = 0x3c6ef372;
      local_1e0.s[3] = 0xa54ff53a;
      local_1e0.s[4] = 0x510e527f;
      local_1e0.s[5] = 0x9b05688c;
      local_1e0.s[6] = 0x1f83d9ab;
      local_1e0.s[7] = 0x5be0cd19;
      local_1e0.bytes = 0;
      uVar2 = (uint)local_280;
      local_294 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      local_298 = 0;
      local_284 = local_294;
      secp256k1_sha256_write(&local_1e0,local_248,0x20);
      secp256k1_sha256_write(&local_1e0,m,mlen);
      secp256k1_sha256_write(&local_1e0,(uchar *)&local_294,4);
      secp256k1_sha256_write(&local_1e0,(uchar *)&local_298,4);
      secp256k1_sha256_finalize(&local_1e0,local_208);
      secp256k1_scalar_set_b32(&local_278,local_208,&local_29c);
      if ((local_29c != 0) ||
         (((local_278.d[1] == 0 && local_278.d[0] == 0) && local_278.d[2] == 0) &&
          local_278.d[3] == 0)) {
        return 0;
      }
      psVar5 = local_240 + local_290;
      psVar4 = local_238 + local_290;
      uVar7 = 0;
      while (psVar1 = local_280, uVar7 < secidx[(long)local_280]) {
        secp256k1_ecmult(&local_178,psVar4,&local_278,psVar5);
        if (local_178.infinity != 0) {
          return 0;
        }
        secp256k1_ge_set_gej_var(&local_f8,&local_178);
        secp256k1_eckey_pubkey_serialize(&local_f8,local_208,&local_250,1);
        local_1e0.s[0] = 0x6a09e667;
        local_1e0.s[1] = 0xbb67ae85;
        local_1e0.s[2] = 0x3c6ef372;
        local_1e0.s[3] = 0xa54ff53a;
        local_1e0.s[4] = 0x510e527f;
        local_1e0.s[5] = 0x9b05688c;
        local_1e0.s[6] = 0x1f83d9ab;
        local_1e0.s[7] = 0x5be0cd19;
        local_1e0.bytes = 0;
        local_294 = local_284;
        uVar2 = (int)uVar7 + 1;
        local_298 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                    uVar2 * 0x1000000;
        secp256k1_sha256_write(&local_1e0,local_208,0x21);
        secp256k1_sha256_write(&local_1e0,m,mlen);
        secp256k1_sha256_write(&local_1e0,(uchar *)&local_294,4);
        secp256k1_sha256_write(&local_1e0,(uchar *)&local_298,4);
        secp256k1_sha256_finalize(&local_1e0,local_208);
        secp256k1_scalar_set_b32(&local_278,local_208,&local_29c);
        if (local_29c != 0) {
          return 0;
        }
        psVar5 = psVar5 + 1;
        psVar4 = psVar4 + 1;
        uVar7 = uVar7 + 1;
        if (((local_278.d[1] == 0 && local_278.d[0] == 0) && local_278.d[2] == 0) &&
            local_278.d[3] == 0) {
          return 0;
        }
      }
      secp256k1_scalar_mul(psVar5,&local_278,local_228 + (long)local_280);
      secp256k1_scalar_negate(psVar5,psVar5);
      secp256k1_scalar_add(psVar5,psVar5,local_230 + (long)psVar1);
      if (((psVar5->d[1] == 0 && psVar5->d[0] == 0) && psVar5->d[2] == 0) && psVar5->d[3] == 0) {
        return 0;
      }
      local_290 = local_290 + rsizes[(long)psVar1];
      local_280 = (secp256k1_scalar *)((long)psVar1 + 1);
    } while (local_280 != (secp256k1_scalar *)nrings);
  }
  return 1;
}

Assistant:

int secp256k1_borromean_sign(const secp256k1_ecmult_gen_context *ecmult_gen_ctx,
 unsigned char *e0, secp256k1_scalar *s, const secp256k1_gej *pubs, const secp256k1_scalar *k, const secp256k1_scalar *sec,
 const size_t *rsizes, const size_t *secidx, size_t nrings, const unsigned char *m, size_t mlen) {
    secp256k1_gej rgej;
    secp256k1_ge rge;
    secp256k1_scalar ens;
    secp256k1_sha256 sha256_e0;
    unsigned char tmp[33];
    size_t i;
    size_t j;
    size_t count;
    size_t size;
    int overflow;
    VERIFY_CHECK(ecmult_gen_ctx != NULL);
    VERIFY_CHECK(e0 != NULL);
    VERIFY_CHECK(s != NULL);
    VERIFY_CHECK(pubs != NULL);
    VERIFY_CHECK(k != NULL);
    VERIFY_CHECK(sec != NULL);
    VERIFY_CHECK(rsizes != NULL);
    VERIFY_CHECK(secidx != NULL);
    VERIFY_CHECK(nrings > 0);
    VERIFY_CHECK(m != NULL);
    secp256k1_sha256_initialize(&sha256_e0);
    count = 0;
    for (i = 0; i < nrings; i++) {
        VERIFY_CHECK(INT_MAX - count > rsizes[i]);
        secp256k1_ecmult_gen(ecmult_gen_ctx, &rgej, &k[i]);
        secp256k1_ge_set_gej(&rge, &rgej);
        if (secp256k1_gej_is_infinity(&rgej)) {
            return 0;
        }
        secp256k1_eckey_pubkey_serialize(&rge, tmp, &size, 1);
        for (j = secidx[i] + 1; j < rsizes[i]; j++) {
            secp256k1_borromean_hash(tmp, m, mlen, tmp, 33, i, j);
            secp256k1_scalar_set_b32(&ens, tmp, &overflow);
            if (overflow || secp256k1_scalar_is_zero(&ens)) {
                return 0;
            }
            /** The signing algorithm as a whole is not memory uniform so there is likely a cache sidechannel that
             *  leaks which members are non-forgeries. That the forgeries themselves are variable time may leave
             *  an additional privacy impacting timing side-channel, but not a key loss one.
             */
            secp256k1_ecmult(&rgej, &pubs[count + j], &ens, &s[count + j]);
            if (secp256k1_gej_is_infinity(&rgej)) {
                return 0;
            }
            secp256k1_ge_set_gej_var(&rge, &rgej);
            secp256k1_eckey_pubkey_serialize(&rge, tmp, &size, 1);
        }
        secp256k1_sha256_write(&sha256_e0, tmp, size);
        count += rsizes[i];
    }
    secp256k1_sha256_write(&sha256_e0, m, mlen);
    secp256k1_sha256_finalize(&sha256_e0, e0);
    count = 0;
    for (i = 0; i < nrings; i++) {
        VERIFY_CHECK(INT_MAX - count > rsizes[i]);
        secp256k1_borromean_hash(tmp, m, mlen, e0, 32, i, 0);
        secp256k1_scalar_set_b32(&ens, tmp, &overflow);
        if (overflow || secp256k1_scalar_is_zero(&ens)) {
            return 0;
        }
        for (j = 0; j < secidx[i]; j++) {
            secp256k1_ecmult(&rgej, &pubs[count + j], &ens, &s[count + j]);
            if (secp256k1_gej_is_infinity(&rgej)) {
                return 0;
            }
            secp256k1_ge_set_gej_var(&rge, &rgej);
            secp256k1_eckey_pubkey_serialize(&rge, tmp, &size, 1);
            secp256k1_borromean_hash(tmp, m, mlen, tmp, 33, i, j + 1);
            secp256k1_scalar_set_b32(&ens, tmp, &overflow);
            if (overflow || secp256k1_scalar_is_zero(&ens)) {
                return 0;
            }
        }
        secp256k1_scalar_mul(&s[count + j], &ens, &sec[i]);
        secp256k1_scalar_negate(&s[count + j], &s[count + j]);
        secp256k1_scalar_add(&s[count + j], &s[count + j], &k[i]);
        if (secp256k1_scalar_is_zero(&s[count + j])) {
            return 0;
        }
        count += rsizes[i];
    }
    secp256k1_scalar_clear(&ens);
    secp256k1_ge_clear(&rge);
    secp256k1_gej_clear(&rgej);
    memset(tmp, 0, 33);
    return 1;
}